

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExistingFileNamer.cpp
# Opt level: O2

string * __thiscall
ApprovalTests::ExistingFileNamer::getReceivedFile
          (string *__return_storage_ptr__,ExistingFileNamer *this,string param_1)

{
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->filePath);
  return __return_storage_ptr__;
}

Assistant:

std::string ExistingFileNamer::getReceivedFile(std::string) const
    {
        return filePath;
    }